

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::Value> * __thiscall
tinyusdz::XformOp::get_scalar
          (optional<tinyusdz::value::Value> *__return_storage_ptr__,XformOp *this)

{
  bool bVar1;
  
  bVar1 = primvar::PrimVar::has_value(&this->_var);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::Value>::
    optional<const_tinyusdz::value::Value_&,_0>(__return_storage_ptr__,&(this->_var)._value);
  }
  else {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<value::Value> get_scalar() const {
    if (has_default()) {
      return _var.value_raw();
    }
    return nonstd::nullopt;
  }